

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IncompleteCubeFormatCase::createTexture(IncompleteCubeFormatCase *this)

{
  deUint32 format_00;
  deUint32 height;
  int iVar1;
  int iVar2;
  GLenum GVar3;
  int *piVar4;
  void *pixels;
  PixelBufferAccess local_d0;
  deUint32 local_a8;
  CubeFace local_a4;
  deUint32 format;
  int targetNdx;
  int levelH;
  int levelW;
  PixelBufferAccess local_88;
  int local_5c;
  int local_58;
  int levelNdx;
  int numLevels;
  GLuint local_44;
  undefined1 local_40 [4];
  GLuint texture;
  TextureLevel levelData;
  TextureFormat fmt;
  IncompleteCubeFormatCase *this_local;
  
  levelData.m_data.m_cap = (size_t)glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_40,(TextureFormat *)&levelData.m_data.m_cap)
  ;
  glwGenTextures(1,&local_44);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0x8513,local_44);
  glwTexParameteri(0x8513,0x2802,0x2901);
  glwTexParameteri(0x8513,0x2803,0x2901);
  glwTexParameteri(0x8513,0x2801,0x2700);
  glwTexParameteri(0x8513,0x2800,0x2600);
  piVar4 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar1 = ::deLog2Floor32(*piVar4);
  piVar4 = tcu::Vector<int,_2>::y(&this->m_size);
  iVar2 = ::deLog2Floor32(*piVar4);
  local_58 = de::max<int>(iVar1,iVar2);
  local_58 = local_58 + 1;
  for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 1) {
    piVar4 = tcu::Vector<int,_2>::x(&this->m_size);
    iVar1 = *piVar4;
    piVar4 = tcu::Vector<int,_2>::y(&this->m_size);
    tcu::TextureLevel::setSize((TextureLevel *)local_40,iVar1,*piVar4,1);
    tcu::TextureLevel::getAccess(&local_88,(TextureLevel *)local_40);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&levelH,0.0,0.0,1.0,1.0);
    tcu::clear(&local_88,(Vec4 *)&levelH);
    piVar4 = tcu::Vector<int,_2>::x(&this->m_size);
    targetNdx = de::max<int>(1,*piVar4 >> ((byte)local_5c & 0x1f));
    piVar4 = tcu::Vector<int,_2>::y(&this->m_size);
    format = de::max<int>(1,*piVar4 >> ((byte)local_5c & 0x1f));
    for (local_a4 = CUBEFACE_NEGATIVE_X; iVar2 = local_5c, iVar1 = targetNdx, height = format,
        (int)local_a4 < 6; local_a4 = local_a4 + CUBEFACE_POSITIVE_X) {
      local_a8 = *(deUint32 *)&(this->super_TexCubeCompletenessCase).field_0x84;
      if ((local_5c == 0) &&
         ((this->m_invalidCubeFace == CUBEFACE_LAST || (this->m_invalidCubeFace == local_a4)))) {
        local_a8 = this->m_invalidFormat;
      }
      format_00 = local_a8;
      GVar3 = *(GLenum *)(s_cubeTargets + (long)(int)local_a4 * 4);
      tcu::TextureLevel::getAccess(&local_d0,(TextureLevel *)local_40);
      pixels = tcu::PixelBufferAccess::getDataPtr(&local_d0);
      glwTexImage2D(GVar3,iVar2,format_00,iVar1,height,0,format_00,0x1401,pixels);
    }
  }
  GVar3 = glwGetError();
  glu::checkError(GVar3,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x2c2);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_40);
  return;
}

Assistant:

void IncompleteCubeFormatCase::createTexture (void)
{
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_CUBE_MAP, texture);

	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
		{
			deUint32 format = m_format;
			if (levelNdx == 0 && (m_invalidCubeFace == tcu::CUBEFACE_LAST || m_invalidCubeFace == targetNdx))
				format = m_invalidFormat;

			glTexImage2D(s_cubeTargets[targetNdx], levelNdx, format, levelW, levelH, 0, format, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
		}
	}

	GLU_CHECK_MSG("Set texturing state");
}